

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::Read(ON_RevSurface *this,ON_BinaryArchive *file)

{
  int iVar1;
  ON_Curve *pOVar2;
  double *pdVar3;
  double dVar4;
  ON_Object *local_40;
  ON_Object *obj_1;
  ON_Object *pOStack_30;
  int bTransposedAsInt_1;
  ON_Object *obj;
  int bTransposedAsInt;
  bool rc;
  int iStack_1c;
  char bHaveCurve;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_RevSurface *this_local;
  
  iStack_1c = 0;
  bTransposedAsInt = 0;
  obj._7_1_ = '\0';
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  obj._6_1_ = ON_BinaryArchive::Read3dmChunkVersion(file,&stack0xffffffffffffffe4,&bTransposedAsInt)
  ;
  if (((bool)obj._6_1_) && (iStack_1c == 1)) {
    obj._6_1_ = ON_BinaryArchive::ReadLine(_minor_version,&this->m_axis);
    obj._6_1_ = ON_BinaryArchive::ReadInterval(_minor_version,&this->m_angle);
    obj._6_1_ = ON_BinaryArchive::ReadBoundingBox(_minor_version,&this->m_bbox);
    obj._0_4_ = (uint)((this->m_bTransposed & 1U) != 0);
    obj._6_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&obj);
    if ((bool)obj._6_1_) {
      this->m_bTransposed = (bool)(-((uint)obj != 0) & 1);
    }
    obj._6_1_ = ON_BinaryArchive::ReadChar(_minor_version,(char *)((long)&obj + 7));
    if (obj._7_1_ != '\0') {
      pOStack_30 = (ON_Object *)0x0;
      iVar1 = ON_BinaryArchive::ReadObject(_minor_version,&stack0xffffffffffffffd0);
      obj._6_1_ = iVar1 != 0;
      if (pOStack_30 != (ON_Object *)0x0) {
        pOVar2 = ON_Curve::Cast(pOStack_30);
        this->m_curve = pOVar2;
        if ((this->m_curve == (ON_Curve *)0x0) && (pOStack_30 != (ON_Object *)0x0)) {
          (*pOStack_30->_vptr_ON_Object[4])();
        }
      }
    }
    dVar4 = ON_Interval::Min(&this->m_angle);
    pdVar3 = ON_Interval::operator[](&this->m_t,0);
    *pdVar3 = dVar4;
    dVar4 = ON_Interval::Max(&this->m_angle);
    pdVar3 = ON_Interval::operator[](&this->m_t,1);
    *pdVar3 = dVar4;
  }
  else if (((bool)obj._6_1_) && (iStack_1c == 2)) {
    obj._6_1_ = ON_BinaryArchive::ReadLine(_minor_version,&this->m_axis);
    obj._6_1_ = ON_BinaryArchive::ReadInterval(_minor_version,&this->m_angle);
    obj._6_1_ = ON_BinaryArchive::ReadInterval(_minor_version,&this->m_t);
    obj._6_1_ = ON_BinaryArchive::ReadBoundingBox(_minor_version,&this->m_bbox);
    obj_1._4_4_ = (uint)((this->m_bTransposed & 1U) != 0);
    obj._6_1_ = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)((long)&obj_1 + 4));
    if ((bool)obj._6_1_) {
      this->m_bTransposed = (bool)(-(obj_1._4_4_ != 0) & 1);
    }
    obj._6_1_ = ON_BinaryArchive::ReadChar(_minor_version,(char *)((long)&obj + 7));
    if (obj._7_1_ != '\0') {
      local_40 = (ON_Object *)0x0;
      iVar1 = ON_BinaryArchive::ReadObject(_minor_version,&local_40);
      obj._6_1_ = iVar1 != 0;
      if (local_40 != (ON_Object *)0x0) {
        pOVar2 = ON_Curve::Cast(local_40);
        this->m_curve = pOVar2;
        if ((this->m_curve == (ON_Curve *)0x0) && (local_40 != (ON_Object *)0x0)) {
          (*local_40->_vptr_ON_Object[4])();
        }
      }
    }
  }
  return (bool)(obj._6_1_ & 1);
}

Assistant:

bool ON_RevSurface::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  char bHaveCurve = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version == 1) 
  {
    rc = file.ReadLine( m_axis );
    rc = file.ReadInterval( m_angle );
    rc = file.ReadBoundingBox( m_bbox );
    int bTransposedAsInt = m_bTransposed ? 1 : 0;
    rc = file.ReadInt( &bTransposedAsInt );
    if (rc)
      m_bTransposed = bTransposedAsInt ? true : false;
    rc = file.ReadChar( &bHaveCurve );
    if ( bHaveCurve ) 
    {
      ON_Object* obj = 0;
      rc = file.ReadObject(&obj);
      if ( obj ) 
      {
        m_curve = ON_Curve::Cast(obj);
        if ( !m_curve )
          delete obj;
      }
    }
    m_t[0] = m_angle.Min();
    m_t[1] = m_angle.Max();
  }
  else if (rc && major_version == 2) 
  {
    rc = file.ReadLine( m_axis );
    rc = file.ReadInterval( m_angle );
    rc = file.ReadInterval( m_t );
    rc = file.ReadBoundingBox( m_bbox );
    int bTransposedAsInt = m_bTransposed ? 1 : 0;
    rc = file.ReadInt( &bTransposedAsInt );
    if (rc) 
      m_bTransposed = bTransposedAsInt ? true : false;
    rc = file.ReadChar( &bHaveCurve );
    if ( bHaveCurve ) 
    {
      ON_Object* obj = 0;
      rc = file.ReadObject(&obj);
      if ( obj ) 
      {
        m_curve = ON_Curve::Cast(obj);
        if ( !m_curve )
          delete obj;
      }
    }
  }
  return rc;
}